

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O1

Score Search::search<(Nodetype)2>(position *pos,int16 alpha,int16 beta,U16 depth,node *stack)

{
  int *piVar1;
  byte bVar2;
  Searchthread *t;
  U64 UVar3;
  double dVar4;
  Score SVar5;
  U8 UVar6;
  U8 UVar7;
  node *pnVar8;
  Score SVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  U16 depth_00;
  short sVar14;
  Score SVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  undefined7 uVar24;
  ushort uVar25;
  int16 beta_00;
  undefined8 extraout_RDX;
  undefined8 uVar26;
  byte bVar27;
  short sVar28;
  Score SVar29;
  Score SVar30;
  float __x;
  Move move;
  bool local_251;
  Move local_24a;
  Move local_247;
  undefined4 local_244;
  Score bestScore;
  uint local_23c;
  Score local_238;
  byte local_231;
  byte local_230;
  Move pre_pre_move;
  Move pre_move;
  bool pvNode;
  int local_228;
  Score local_224;
  undefined4 local_220;
  int local_21c;
  Score ttvalue;
  undefined4 local_214;
  uint local_210;
  U8 local_20b;
  U8 local_20a;
  U8 local_209;
  node *local_208;
  U64 local_200;
  ulong local_1f8;
  int local_1ec;
  node *local_1e8;
  Score local_1dc;
  uint local_1d8;
  Score local_1d4;
  Score local_1d0;
  int16 local_1ca;
  vector<Move,_std::allocator<Move>_> quiets;
  Moveorder mvs;
  Move pv [68];
  
  if (UCI_SIGNALS.stop) {
    return draw;
  }
  local_1e8 = stack;
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DoubleEspresso[P]chess/src/search.hpp"
                  ,0x139,
                  "Score Search::search(position &, int16, int16, U16, node *) [type = non_pv]");
  }
  SVar30 = (Score)alpha;
  bestScore = ninf;
  local_247.f = '\0';
  local_247.t = '\0';
  local_247.type = '\x11';
  local_24a.f = '\0';
  local_24a.t = '\0';
  local_24a.type = '\x11';
  lVar19 = 2;
  do {
    *(undefined2 *)((long)pv + lVar19 + -2) = 0;
    (&pv[0].f)[lVar19] = '\x11';
    lVar19 = lVar19 + 3;
  } while (lVar19 != 0xce);
  ttvalue = ninf;
  bVar10 = position::in_check(pos);
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1e8->in_check = bVar10;
  iVar17 = *(int *)(local_1e8 + -1);
  local_1e8->ply = (U16)(iVar17 + 1U);
  pvNode = false;
  if (!bVar10) {
    bVar11 = position::is_draw(pos);
    SVar29 = draw;
    if (bVar11) goto LAB_0012bf85;
  }
  pnVar8 = local_1e8;
  uVar22 = iVar17 + 1U & 0xffff;
  SVar29 = mate - uVar22;
  SVar5 = (int)beta;
  if (SVar29 < beta) {
    SVar5 = SVar29;
  }
  sVar28 = (short)SVar5;
  if (SVar30 < SVar29) {
    SVar29 = uVar22 + mated;
    if (SVar30 < SVar29) {
      SVar30 = SVar29;
    }
    alpha = (int16)SVar30;
    bVar11 = SVar29 < sVar28;
  }
  else {
    bVar11 = false;
  }
  if (!bVar11) goto LAB_0012bf85;
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
       '\0';
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
       '\0';
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_1_ =
       '\x11';
  local_200 = (pos->ifo).key;
  bVar12 = hash_table::fetch(&ttable,&local_200,(hash_data *)&mvs);
  bVar11 = true;
  if (bVar12) {
    local_24a = mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._2_3_;
    hashHits = hashHits + 1;
    ttvalue = (Score)mvs._vptr_Moveorder._4_2_;
    if ((int)(uint)depth <= (int)(char)mvs._vptr_Moveorder) {
      if (ttvalue < sVar28) {
        if (mvs._vptr_Moveorder._1_1_ == '\x01') {
LAB_0012b540:
          local_200 = CONCAT62(local_200._2_6_,depth);
          haVoc::Movehistory::update
                    (&pos->stats,pos,&local_24a,&pnVar8[-1].curr_move,(int16 *)&local_200,&ttvalue,
                     &quiets,pnVar8->killers);
          bVar11 = false;
          SVar29 = ttvalue;
        }
      }
      else if (mvs._vptr_Moveorder._1_1_ == '\0') goto LAB_0012b540;
    }
  }
  if (!bVar11) {
LAB_0012bf85:
    if (quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return SVar29;
  }
  bVar11 = (DAT_00141b78 & (pos->pcs).bitmap._M_elems[1]._M_elems[0]) != 0;
  bVar12 = (DAT_00141ba0 & (pos->pcs).bitmap._M_elems[0]._M_elems[0]) != 0;
  local_23c = CONCAT31(local_23c._1_3_,bVar11 || bVar12);
  local_1f8 = (ulong)depth;
  SVar30 = ttvalue;
  if (ttvalue == ninf) {
    SVar30 = pnVar8[-2].static_eval;
    if ((SVar30 == ninf || bVar10) || (SVar30 < pnVar8[-1].static_eval)) {
      SVar30 = ninf;
      if (!bVar10) {
        t = SearchThreads.workers.
            super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>._M_impl.
            super__Vector_impl_data._M_start[pos->thread_id];
        if (bVar11 || bVar12) {
          mvs._vptr_Moveorder._0_4_ = -1.0;
        }
        else {
          dVar4 = exp(((double)depth + -64.0) / 20.0);
          mvs._vptr_Moveorder._0_4_ = (float)((1.0 - dVar4) * 225.0);
        }
        __x = eval::evaluate(pos,t,(float *)&mvs);
        lVar19 = lroundf(__x);
        SVar30 = (Score)lVar19;
      }
    }
    else {
      SVar30 = SVar30 + 0xf;
    }
  }
  pnVar8->static_eval = SVar30;
  if (((bVar10) || (pnVar8[-1].curr_move.type != '\n')) || (pnVar8->null_search != false)) {
    bVar11 = false;
  }
  else {
    bVar11 = (((int)alpha - (int)sVar28) + 1U & 0xfffffffd) == 0 && SVar30 != ninf;
  }
  bVar12 = (pos->ifo).stm != white;
  if (((bVar11) && (5 < depth)) &&
     (((((pos->pcs).bitmap._M_elems[bVar12]._M_elems[2] != 0 ||
        (pos->pcs).bitmap._M_elems[bVar12]._M_elems[1] != 0) ||
       (pos->pcs).bitmap._M_elems[bVar12]._M_elems[3] != 0) ||
       (pos->pcs).bitmap._M_elems[bVar12]._M_elems[4] != 0 &&
      (local_238 = (Score)sVar28, local_238 <= SVar30 + (int)local_1f8 * 8 + 0xfffffe00)))) {
    pnVar8[1].null_search = true;
    position::do_null_move(pos);
    depth_00 = depth - (short)(local_1f8 >> 1);
    if ((short)depth_00 < 2) {
      SVar30 = qsearch<(Nodetype)2>(pos,-sVar28,1 - sVar28,0,pnVar8 + 1);
    }
    else {
      SVar30 = search<(Nodetype)2>(pos,-sVar28,1 - sVar28,depth_00,pnVar8 + 1);
    }
    position::undo_null_move(pos);
    SVar15 = -SVar30;
    pnVar8[1].null_search = false;
    SVar9 = SVar15;
    if (((local_238 != SVar15 && SBORROW4(local_238,SVar15) == local_238 + SVar30 < 0) &&
        (SVar9 = SVar29, pnVar8[1].best_move.type == '\v')) && (499 < SVar30 + local_238)) {
      UVar6 = pnVar8[1].best_move.t;
      (pnVar8->threat_move).f = pnVar8[1].best_move.f;
      (pnVar8->threat_move).t = UVar6;
      (pnVar8->threat_move).type = '\v';
    }
    SVar29 = SVar9;
    if (local_238 == SVar15 || SBORROW4(local_238,SVar15) != local_238 + SVar30 < 0)
    goto LAB_0012bf85;
  }
  pnVar8 = local_1e8;
  haVoc::Moveorder::Moveorder(&mvs,pos,&local_24a,local_1e8);
  move.f = '\0';
  move.t = '\0';
  move.type = '\x11';
  pre_move.f = pnVar8[-1].curr_move.f;
  pre_move.t = pnVar8[-1].curr_move.t;
  pre_move.type = pnVar8[-1].curr_move.type;
  pre_pre_move.f = pnVar8[-2].curr_move.f;
  pre_pre_move.t = pnVar8[-2].curr_move.t;
  pre_pre_move.type = pnVar8[-2].curr_move.type;
  local_1d0 = pnVar8[-2].static_eval;
  local_1d4 = pnVar8->static_eval;
  uVar20 = (ulong)(pos->ifo).stm;
  uVar16 = (uint)(pos->ifo).key & 0x3ff;
  if (searching_positions[uVar16].searching == false) {
    uVar25 = pos->thread_id;
    searching_positions[uVar16].searching = true;
    searching_positions[uVar16].id = (uint)uVar25;
  }
  bVar11 = local_1d0 <= local_1d4;
  iVar18 = (int)local_1f8;
  local_1d8 = iVar18 * iVar18 + 6U >> (local_1d4 < local_1d0);
  local_224 = (Score)alpha;
  local_208 = pnVar8 + 1;
  local_230 = depth < 3 | (byte)local_23c;
  iVar17 = 0x3f;
  if (iVar18 < 0x3f) {
    iVar17 = iVar18;
  }
  local_1dc = (Score)sVar28;
  local_21c = (int)-sVar28;
  local_228 = (int)-alpha;
  local_1ec = (int)~alpha;
  local_23c = 0;
  local_238 = SVar5;
  do {
    bVar12 = haVoc::Moveorder::next_move
                       (&mvs,pos,&move,&pre_move,&pre_pre_move,&pnVar8->threat_move,false,false);
    if (!bVar12) {
      UVar3 = (pos->ifo).key;
      uVar16 = (uint)UVar3 & 0x3ff;
      searching_positions[uVar16].searching = false;
      searching_positions[uVar16].id = -1;
      if ((local_224 <= bestScore) && (bestScore < (short)(undefined2)local_238)) {
        if (local_247.f != local_247.t) {
          piVar1 = pnVar8->bestMoveHistory->bm[uVar20][local_247.f] + local_247.t;
          *piVar1 = *piVar1 + (int)local_1f8 * 2;
        }
      }
      if ((ushort)local_23c == 0) {
        SVar29 = draw;
        if (bVar10) {
          SVar29 = uVar22 + mated;
        }
      }
      else {
        local_209 = (U8)depth;
        local_20a = bestScore < (short)(undefined2)local_238;
        local_20b = (U8)pnVar8->ply;
        local_1ca = (int16)bestScore;
        local_200 = UVar3;
        hash_table::save(&ttable,&local_200,&local_209,&local_20a,&local_20b,&local_247,&local_1ca,
                         &pvNode);
        SVar29 = bestScore;
      }
LAB_0012bf78:
      haVoc::Moveorder::~Moveorder(&mvs);
      goto LAB_0012bf85;
    }
    if (UCI_SIGNALS.stop != false) {
      SVar29 = draw;
      goto LAB_0012bf78;
    }
  } while ((move.type == '\x11') || (bVar12 = position::is_legal(pos,&move), !bVar12));
  uVar26 = extraout_RDX;
  if ((move.f == local_24a.f) && (move.t == local_24a.t)) {
    uVar26 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
    local_244 = (undefined4)uVar26;
    if (move.type != local_24a.type) goto LAB_0012b9b7;
  }
  else {
LAB_0012b9b7:
    if ((move.f == pnVar8->killers[0].f) && (move.t == pnVar8->killers[0].t)) {
      uVar26 = CONCAT71((int7)((ulong)uVar26 >> 8),1);
      local_244 = (undefined4)uVar26;
      if (move.type == pnVar8->killers[0].type) goto LAB_0012ba34;
    }
    if ((move.f == pnVar8->killers[1].f) && (move.t == pnVar8->killers[1].t)) {
      uVar26 = CONCAT71((int7)((ulong)uVar26 >> 8),1);
      local_244 = (undefined4)uVar26;
      if (move.type == pnVar8->killers[1].type) goto LAB_0012ba34;
    }
    if (((move.f != pnVar8->killers[2].f) || (move.t != pnVar8->killers[2].t)) ||
       (local_244 = (undefined4)CONCAT71((int7)((ulong)uVar26 >> 8),1),
       move.type != pnVar8->killers[2].type)) {
      if ((move.f == pnVar8->killers[3].f) && (move.t == pnVar8->killers[3].t)) {
        local_244 = (undefined4)CONCAT71(extraout_var,move.type == pnVar8->killers[3].type);
      }
      else {
        local_244 = 0;
      }
    }
  }
LAB_0012ba34:
  bVar12 = position::is_promotion(pos,&move.type);
  uVar23 = (ulong)(move.type - 0xb);
  local_251 = true;
  if (1 < (byte)(move.type - 0xb)) {
    local_200 = CONCAT44(local_200._4_4_,(uint)move.type);
    local_251 = position::is_cap_promotion(pos,(Movetype *)&local_200);
  }
  if ((pos->pcs).piece_on._M_elems[move.t] == pawn) {
    uVar24 = (undefined7)(uVar23 >> 8);
    if (uVar20 == 0) {
      local_220 = (undefined4)CONCAT71(uVar24,0x27 < move.t);
    }
    else {
      local_220 = (undefined4)CONCAT71(uVar24,move.t < 0x18);
    }
  }
  else {
    local_220 = 0;
  }
  local_231 = pnVar8[-1].curr_move.type == '\v';
  if ((pnVar8->threat_move).type == '\x11') {
    local_210 = 0;
  }
  else {
    local_210 = (uint)(byte)((pnVar8->threat_move).f == move.t & local_251);
  }
  if (move.type == '\n') {
    bVar13 = position::quiet_gives_dangerous_check(pos,&move);
    local_214 = (undefined4)CONCAT71(extraout_var_00,bVar13);
  }
  else {
    local_214 = 0;
  }
  if (((((!bVar10 && (byte)local_244 == '\0') && local_251 == true) && !bVar12) &&
      ((1 < (ushort)local_23c && depth < 2) && bestScore < local_224)) &&
     (iVar18 = position::see(pos,&move), iVar18 < 0)) {
    uVar22 = 2;
    goto LAB_0012be7a;
  }
  position::do_move(pos,&move);
  (pnVar8->curr_move).f = move.f;
  (pnVar8->curr_move).t = move.t;
  (pnVar8->curr_move).type = move.type;
  bVar13 = position::in_check(pos);
  bVar21 = local_1d0 <= local_1d4 | (byte)local_244;
  bVar27 = 2 < depth | local_251;
  uVar25 = (ushort)bVar13;
  bVar2 = (byte)local_220;
  if (bVar21 == 0 && bVar27 == 0) {
    uVar25 = bVar13 + 1;
    if (((bVar2 | (byte)local_214 | (byte)local_210) & 1) == 0) {
      uVar25 = (ushort)bVar13;
    }
    if (bestScore < 0xffffd932) {
      uVar25 = (ushort)bVar13;
    }
    if (local_224 <= bestScore) {
      uVar25 = (ushort)bVar13;
    }
  }
  sVar28 = uVar25 + depth +
           ((byte)((bVar12 || bVar13) | bVar21 | bVar10 | bVar27 | bVar2 | local_224 < bestScore) |
           0xfffe);
  pnVar8[1].pv = (Move *)0x0;
  beta_00 = (int16)local_228;
  if ((ushort)local_23c < 3) {
    pnVar8[1].pv = pv;
    pv[0].f = '\0';
    pv[0].t = '\0';
    pv[0].type = '\x11';
    if (sVar28 < 2) {
      SVar30 = qsearch<(Nodetype)1>(pos,(int16)local_21c,beta_00,0,local_208);
    }
    else {
      SVar30 = search<(Nodetype)1>(pos,(int16)local_21c,beta_00,sVar28 - 1,local_208);
    }
LAB_0012bd97:
    SVar30 = -SVar30;
  }
  else {
    sVar14 = sVar28;
    if ((((bVar12 | bVar2 | (byte)local_244 | (byte)local_210 | (byte)local_214 | bVar10 | bVar13 |
          local_230) & 1) == 0 && (local_251 & local_231) == 0) && (bestScore <= local_224)) {
      uVar22 = local_23c & 0xffff;
      if (0x3e < (local_23c & 0xffff)) {
        uVar22 = 0x3f;
      }
      sVar14 = sVar28 - *(short *)((long)&bitboards::reductions +
                                  (ulong)uVar22 * 4 +
                                  (ulong)(uint)(iVar17 << 8) + (ulong)bVar11 * 0x4000);
    }
    if (sVar14 < 2) {
      SVar30 = qsearch<(Nodetype)2>(pos,(int16)local_1ec,beta_00,0,local_208);
    }
    else {
      SVar30 = search<(Nodetype)2>(pos,(int16)local_1ec,beta_00,sVar14 - 1,local_208);
    }
    SVar30 = -SVar30;
    if (local_224 < SVar30) {
      pnVar8[1].pv = pv;
      pv[0].f = '\0';
      pv[0].t = '\0';
      pv[0].type = '\x11';
      if (sVar28 < 2) {
        SVar30 = qsearch<(Nodetype)1>(pos,(int16)local_21c,(int16)local_228,0,local_208);
      }
      else {
        SVar30 = search<(Nodetype)1>(pos,(int16)local_21c,(int16)local_228,sVar28 - 1,local_208);
      }
      goto LAB_0012bd97;
    }
  }
  if (move.type == '\n') {
    std::vector<Move,std::allocator<Move>>::emplace_back<Move&>
              ((vector<Move,std::allocator<Move>> *)&quiets,&move);
  }
  position::undo_move(pos,&move);
  local_23c = local_23c + 1;
  if (UCI_SIGNALS.stop == false) {
    uVar22 = 0;
    if (bestScore < SVar30) {
      UVar6 = move.f;
      UVar7 = move.t;
      local_247.f = move.f;
      local_247.t = move.t;
      local_247.type = move.type;
      (pnVar8->best_move).f = UVar6;
      (pnVar8->best_move).t = UVar7;
      (pnVar8->best_move).type = move.type;
      bestScore = SVar30;
      if (local_1dc <= SVar30) {
        local_200 = CONCAT62(local_200._2_6_,depth);
        haVoc::Movehistory::update
                  (&pos->stats,pos,&local_247,&pnVar8[-1].curr_move,(int16 *)&local_200,&bestScore,
                   &quiets,pnVar8->killers);
        SVar30 = (*(code *)0x12be8c)();
        return SVar30;
      }
    }
  }
  else {
    uVar22 = 1;
  }
LAB_0012be7a:
  SVar30 = (*(code *)((long)&DAT_00132e30 + (long)(int)(&DAT_00132e30)[uVar22]))();
  return SVar30;
}

Assistant:

Score Search::search(position& pos, int16 alpha, int16 beta, U16 depth, node* stack) {

	if (UCI_SIGNALS.stop)
		return Score::draw;

	assert(alpha < beta);

	Score bestScore = Score::ninf;
	Move best_move = {};
	best_move.type = Movetype::no_type;
	size_t deferred = 0;

	Move ttm = {}; ttm.type = Movetype::no_type; // refactor me
	Move pv[Depth::MAX_PLY + 4];
	Score ttvalue = Score::ninf;

	bool in_check = pos.in_check();
	std::vector<Move> quiets;
	stack->in_check = in_check;
	stack->ply = (stack - 1)->ply + 1;


	U16 root_dist = stack->ply;
	const bool root_node = (type == Nodetype::root && stack->ply == 1);
	const bool pvNode = (root_node || type == Nodetype::pv);
	if (pvNode && selDepth < stack->ply + 1 && main_thread(pos))
		selDepth++;

	if (!root_node && !in_check && pos.is_draw())
			return Score::draw;

	{ // mate distance pruning
		Score mating_score = Score(Score::mate - root_dist);
		beta = std::min(mating_score, Score(beta));
		if (alpha >= mating_score)
			return mating_score;

		Score mated_score = Score(Score::mated + root_dist);
		alpha = std::max(mated_score, Score(alpha));
		if (beta <= mated_score)
			return mated_score;
	}

	// hashtable lookup
	auto hashHit = false;
	{
		hash_data e;
		hashHit = ttable.fetch(pos.key(), e);
		if (hashHit) {
			ttm = e.move;
			hashHits++;
			ttvalue = Score(e.score);
			if (!pvNode &&
				e.depth >= depth &&
				(ttvalue >= beta ? e.bound == bound_low : e.bound == bound_high)) {
				pos.stats_update(ttm, (stack - 1)->curr_move, depth, ttvalue, quiets, stack->killers);
				return ttvalue;
			}
		}
	}

	// static evaluation
	const bool anyPawnsOn7th = pos.pawns_near_promotion(); // either side has pawns on 7th
	const bool weHavePawnsOn7th = pos.pawns_on_7th(); // only side to move has pawns on 7th

	Score static_eval = (ttvalue != Score::ninf ? ttvalue :
		(stack-2)->static_eval != ninf && !in_check && (stack-2)->static_eval >= (stack-1)->static_eval ? Score((stack-2)->static_eval + 15) :
		!in_check ? 
		Score(std::lround(eval::evaluate(pos, *SearchThreads[pos.id()], lazy_eval_margin_search(depth, anyPawnsOn7th)))) :
		Score::ninf);
	 
	//Score static_eval = Score::ninf;
	//if (ttvalue == Score::ninf &&
	//	!pvNode && 
	//	!in_check && 
	//	(stack - 2)->static_eval != Score::ninf &&
	//	(stack - 1)->best_move.type == Movetype::quiet)
	//	static_eval = Score((stack - 2)->static_eval + 33);
	//else if (!in_check)
	//	static_eval = Score(std::lround(eval::evaluate(pos, *SearchThreads[pos.id()], lazy_eval_margin_search(depth, anyPawnsOn7th))));
	stack->static_eval = static_eval;
	bool hasStaticValue = static_eval != Score::ninf;


	// 0. Define the forward pruning conditions
	const bool forward_prune =
		(!in_check &&
		!pvNode &&
		(stack - 1)->curr_move.type == Movetype::quiet &&
		!stack->null_search &&
		abs(alpha - beta) == 1 && // only prune in null windows (same condition as !pv_node)
		hasStaticValue);

	// 1. Futility pruning
	//if (forward_prune &&
	//	!weHavePawnsOn7th &&
	//	depth <= 1 &&
	//	static_eval > mated_max_ply &&
	//	static_eval + 1150 < alpha)
	//	return Score(static_eval);

	// 2. Null move pruning
	bool null_move_allowed = (pos.to_move() == white ?
		pos.non_pawn_material<white>() :
		pos.non_pawn_material<black>());
	if (forward_prune &&
		null_move_allowed &&
		depth >= 6 &&
		static_eval - 8 * (64 - depth) >= beta) {

		int16 R = (depth >= 6 ? depth / 2 : 2);
		int16 ndepth = depth - R;

		(stack + 1)->null_search = true;
		pos.do_null_move();
		Score null_eval = Score(ndepth <= 1 ?
			-qsearch<non_pv>(pos, -beta, -beta + 1, 0, stack + 1) :
			-search<non_pv>(pos, -beta, -beta + 1, ndepth, stack + 1));
		pos.undo_null_move();
		(stack + 1)->null_search = false;


		// verification
		//null_eval = Score(ndepth <= 1 ?
		//	qsearch<non_pv>(pos, beta-1, beta, 0, stack) :
		//	search<non_pv>(pos, beta-1, beta, ndepth, stack));

		if (null_eval >= beta)
			return Score(null_eval);
		else {
			Move tm = (stack + 1)->best_move;
			if (tm.type == Movetype::capture && beta - null_eval >= 500)
				stack->threat_move = tm;
		}
	}

	// Main search
	U16 moves_searched = 0;
	haVoc::Moveorder mvs(pos, ttm, stack);
	Move move;
	Move pre_move = (stack - 1)->curr_move;
	Move pre_pre_move = (stack - 2)->curr_move;
	bool improving = stack->static_eval - (stack - 2)->static_eval >= 0;
	auto to_mv = pos.to_move();
	int SEE = 0;
	auto skipQuiets = false;
	auto rootMoves = root_node && pos.root_moves[0].pv.size() > 4;

	set_searching(pos, {}, pos.id());

	while (mvs.next_move(pos, move, pre_move, pre_pre_move, stack->threat_move, skipQuiets, rootMoves)) {

		if (UCI_SIGNALS.stop)
			return Score::draw;

		if (move.type == Movetype::no_type || !pos.is_legal(move))
			continue;


		if (main_thread(pos) && root_node && elapsed > 3000)
			std::cout << "info depth " << depth
			<< " currmove " << uci::move_to_string(move)
			<< " currmovenumber " << moves_searched << std::endl;

		// Set move data
		auto hashOrKiller = (move == ttm) ||
			(move == stack->killers[0]) ||
			(move == stack->killers[1]) ||
			(move == stack->killers[2]) ||
			(move == stack->killers[3]);
		auto isPromotion = pos.is_promotion(move.type);
		auto isCapture =
			(move.type == Movetype::capture) ||
			(move.type == Movetype::ep) ||
			pos.is_cap_promotion(Movetype(move.type));
		auto isQuiet = move.type == Movetype::quiet;
		auto isEvasion = in_check;
		auto advancedPawnPush = (pos.piece_on(Square(move.t)) == Piece::pawn) &&
			(to_mv == white ? util::row(move.t) >= Row::r6 : util::row(move.t) <= Row::r3);
		auto quietFollowingCapture = (stack - 1)->curr_move.type == Movetype::capture && isQuiet;
		auto quietFollowup = (stack - 1)->curr_move.type == Movetype::quiet && isQuiet;
		auto captureFollowup = (stack - 1)->curr_move.type == Movetype::capture && isCapture;
		auto threatResponse = (stack->threat_move.type != Movetype::no_type && stack->threat_move.f == move.t) && isCapture;
		auto dangerousQuietCheck = isQuiet && pos.quiet_gives_dangerous_check(move);

		// 4. Skip moves with negative see scores
		if (isCapture &&
			!hashOrKiller &&
			!pvNode &&
			!isEvasion &&
			!isPromotion &&
			bestScore < alpha &&
			depth <= 1 &&
			moves_searched > 1 &&
			(SEE = pos.see(move)) < 0)
			continue;

		// Debug viz readout
		//{
		//	std::unique_lock<std::mutex> lock(search_mtx);
		//	std::cout << "moveReadout " <<
		//		"depth=" << depth <<
		//		" m=" << (pos.to_move() == white ? "W" : "B") << "|" <<
		//		SanPiece[pos.piece_on(Square(move.f))] << "|" <<
		//		util::col(move.f) << "|" << util::row(move.f) << "|" <<
		//		util::col(move.t) << "|" << util::row(move.t) << std::endl;
		//}
		
		pos.do_move(move);
		stack->curr_move = move;

		bool givesCheck = pos.in_check();
		int16 extensions = givesCheck;
		int16 reductions = 1;

		// 5. Reduce uninteresting quiet moves
		if (!pvNode &&
			!improving &&
			!hashOrKiller &&
			!isCapture &&
			!isEvasion &&
			!givesCheck &&
			!isPromotion &&
			!advancedPawnPush &&
			depth <= 2 &&
			bestScore <= alpha)
			reductions += 1;

		// 6. Extend likely interesting quiet moves 
		if (!pvNode &&
			!improving &&
			!hashOrKiller &&
			!isCapture &&
			depth <= 2 &&
			bestScore < alpha &&
			bestScore > mated_max_ply &&
			(dangerousQuietCheck || advancedPawnPush || threatResponse))
			extensions += 1;

		// 7. Reduce losing captures
		//if (isCapture &&
		//	!hashOrKiller &&
		//	!givesCheck &&
		//	!isPromotion &&
		//	!isEvasion &&
		//	bestScore < alpha &&
		//	!advancedPawnPush &&
		//	depth <= 1 &&
		//	SEE < 0)
		//	reductions += 1;

		// 8. Movecount pruning from Stockfish
		skipQuiets = moves_searched >= futility_move_count(improving, depth);

		// 9. Reduction if this position is being searched by another thread
		//if (is_searching(pos, move, pos.id()))
		//	reductions += 1;

		int16 newdepth = depth + extensions - reductions;
		(stack + 1)->pv = nullptr;

		Score score = Score::ninf;
		if (moves_searched < 3) {
			(stack + 1)->pv = pv;
			(stack + 1)->pv[0].set(A1, A1, Movetype::no_type);
			score = Score(newdepth <= 1 ? -qsearch<Nodetype::pv>(pos, -beta, -alpha, 0, stack + 1) :
				-search<Nodetype::pv>(pos, -beta, -alpha, newdepth - 1, stack + 1));
		}
		else {
			int16 LMR = newdepth;
			// Late move reduction for moves unlikely to raise alpha
			if (!threatResponse &&
				!hashOrKiller &&
				!dangerousQuietCheck &&
				!captureFollowup &&
				!advancedPawnPush &&
				!isPromotion &&
				!isEvasion &&
				!givesCheck &&
				!anyPawnsOn7th &&
				depth >= 3 &&
				bestScore <= alpha) {
				unsigned R = reduction(pvNode, improving, depth, moves_searched);
				LMR -= R;
			}

			score = Score(LMR <= 1 ? -qsearch<non_pv>(pos, -alpha - 1, -alpha, 0, stack + 1) :
				-search<non_pv>(pos, -alpha - 1, -alpha, LMR - 1, stack + 1));

			if (score > alpha) {
				(stack + 1)->pv = pv;
				(stack + 1)->pv[0].set(A1, A1, Movetype::no_type);

				score = Score(newdepth <= 1 ? -qsearch<Nodetype::pv>(pos, -beta, -alpha, 0, stack + 1) :
					-search<Nodetype::pv>(pos, -beta, -alpha, newdepth - 1, stack + 1));
			}
		}
		++moves_searched;

		if (move.type == Movetype::quiet)
			quiets.emplace_back(move);


		pos.undo_move(move);

		// return if stop requested - do not updated best move or pv
		if (UCI_SIGNALS.stop)
			return Score::draw;


		// root move update
		if (root_node) {
			auto& rm = *std::find(pos.root_moves.begin(), pos.root_moves.end(), move);

			if (moves_searched == 1 || score > alpha) {
				rm.score = score;
				rm.selDepth = selDepth;
				rm.pv.resize(1);
				for (Move* m = (stack + 1)->pv;; ++m) {
					if (m->f == m->t || m->type == Movetype::no_type)
						break;
					rm.pv.push_back(*m);
				}
			}
			else rm.score = Score::ninf;
		}

		if (score > bestScore) {
			bestScore = score;
			best_move = move;
			stack->best_move = move;

			if (score >= beta) {
				// Update mate killers and quiet move stats
				pos.stats_update(best_move,
					(stack - 1)->curr_move,
					depth, bestScore, quiets, stack->killers);
				break;
			}

			if (score > alpha) {

				if (pvNode)
					alpha = score;

				if (pvNode && !root_node)
					update_pv(stack->pv, move, (stack + 1)->pv);
			}
		}


		// Penalize captures failing to raise alpha
		//if (SEE >= 0 && !pv && score < alpha && move.f != move.t && move.type == Movetype::capture) {
		//	auto capturePenalty = 2 * depth;
		//	stack->capHistory[to_mv][move.f][move.t] -= capturePenalty;
		//}

	} // end moves loop




	unset_searching(pos, {});

	// Update best move stats
	auto bestMoveBonus = 2 * depth;
	if (bestScore >= alpha && bestScore < beta && best_move.f != best_move.t) {
		stack->bestMoveHistory->bm[to_mv][best_move.f][best_move.t] += bestMoveBonus;
	}



	if (moves_searched == 0) {
		return (in_check ? Score(Score::mated + root_dist) : Score::draw);
	}

	Bound bound = (bestScore >= beta ? bound_low :
		pvNode && (best_move.type != Movetype::no_type) ? bound_exact : bound_high);
	ttable.save(pos.key(), depth, U8(bound), stack->ply, best_move, bestScore, pvNode);

	return bestScore;
}